

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path.c
# Opt level: O0

size_t portability_path_get_directory
                 (char *path,size_t path_size,char *absolute,size_t absolute_size)

{
  ulong local_48;
  size_t size;
  size_t last;
  size_t i;
  size_t absolute_size_local;
  char *absolute_local;
  size_t path_size_local;
  char *path_local;
  size_t local_8;
  
  if ((path == (char *)0x0) || (absolute == (char *)0x0)) {
    local_8 = 0;
  }
  else {
    local_48 = absolute_size;
    if (path_size < absolute_size) {
      local_48 = path_size;
    }
    last = 0;
    for (i = 0; path[i] != '\0' && i < local_48; i = i + 1) {
      absolute[i] = path[i];
      if (path[i] == '/') {
        last = i + 1;
      }
    }
    absolute[last] = '\0';
    local_8 = last + 1;
  }
  return local_8;
}

Assistant:

size_t portability_path_get_directory(const char *path, size_t path_size, char *absolute, size_t absolute_size)
{
	if (path == NULL || absolute == NULL)
	{
		return 0;
	}

	size_t i, last, size = path_size < absolute_size ? path_size : absolute_size;

	for (i = 0, last = 0; path[i] != '\0' && i < size; ++i)
	{
		absolute[i] = path[i];

		if (PORTABILITY_PATH_SEPARATOR(path[i]))
		{
			last = i + 1;
		}
	}

	absolute[last] = '\0';

	return last + 1;
}